

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void wand_explode(obj *obj)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  obj->field_0x4c = obj->field_0x4c | 0x80;
  pcVar3 = xname(obj);
  pline("Your %s vibrates violently, and explodes!",pcVar3);
  iVar1 = u.uhpmax * 2;
  uVar2 = mt_random();
  losehp(SUB164(ZEXT416(uVar2) % SEXT816((long)((iVar1 + 2) / 3)),0) + 1,"exploding wand",0);
  useup(obj);
  exercise(0,'\0');
  return;
}

Assistant:

static void wand_explode(struct obj *obj)
{
    obj->in_use = TRUE;	/* in case losehp() is fatal */
    pline("Your %s vibrates violently, and explodes!",xname(obj));
    losehp(rnd(2*(u.uhpmax+1)/3), "exploding wand", KILLED_BY_AN);
    useup(obj);
    exercise(A_STR, FALSE);
}